

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
(anonymous_namespace)::evalFloatOp<slang::shortreal_t,float>
          (ConstantValue *__return_storage_ptr__,_anonymous_namespace_ *this,BinaryOperator op,
          float l,float r)

{
  double dVar1;
  logic_error *this_00;
  undefined4 in_register_00000014;
  bool local_262;
  bool local_261;
  bool local_251;
  bool local_241;
  bool local_231;
  string local_1d0;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  SVInt local_108;
  SVInt local_f8;
  SVInt local_e8;
  SVInt local_d8;
  SVInt local_c8;
  SVInt local_b8;
  SVInt local_a8;
  SVInt local_98;
  SVInt local_88;
  SVInt local_78;
  SVInt local_68 [2];
  SVInt local_48;
  shortreal_t local_34;
  shortreal_t local_30;
  shortreal_t local_2c;
  shortreal_t local_28;
  shortreal_t local_24;
  undefined1 local_1e;
  undefined1 local_1d;
  float local_1c;
  bool br;
  float fStack_18;
  bool bl;
  float r_local;
  float l_local;
  BinaryOperator op_local;
  
  r_local = SUB84(this,0);
  local_1d = l != 0.0;
  local_1e = r != 0.0;
  local_1c = r;
  fStack_18 = l;
  _l_local = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    slang::shortreal_t::shortreal_t(&local_24,l + r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_24);
    break;
  case 1:
    slang::shortreal_t::shortreal_t(&local_28,l - r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_28);
    break;
  case 2:
    slang::shortreal_t::shortreal_t(&local_2c,l * r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_2c);
    break;
  case 3:
    slang::shortreal_t::shortreal_t(&local_30,l / r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_30);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,op));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_1a9);
    std::operator+(&local_188,&local_1a8,":");
    std::__cxx11::to_string(&local_1d0,0x46);
    std::operator+(&local_168,&local_188,&local_1d0);
    std::operator+(&local_148,&local_168,": ");
    std::operator+(&local_128,&local_148,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_128);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case 9:
    slang::SVInt::SVInt<bool,void>(&local_98,(bool)(-(l == r) & 1));
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_98);
    slang::SVInt::~SVInt(&local_98);
    break;
  case 10:
    slang::SVInt::SVInt<bool,void>(&local_a8,(bool)(-(l != r) & 1));
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_a8);
    slang::SVInt::~SVInt(&local_a8);
    break;
  case 0xb:
    slang::SVInt::SVInt<bool,void>(&local_b8,(bool)(-(l == r) & 1));
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_b8);
    slang::SVInt::~SVInt(&local_b8);
    break;
  case 0xc:
    slang::SVInt::SVInt<bool,void>(&local_c8,(bool)(-(l != r) & 1));
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_c8);
    slang::SVInt::~SVInt(&local_c8);
    break;
  case 0xd:
    slang::SVInt::SVInt<bool,void>(&local_48,r <= l);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_48);
    slang::SVInt::~SVInt(&local_48);
    break;
  case 0xe:
    slang::SVInt::SVInt<bool,void>(local_68,r < l);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_68);
    slang::SVInt::~SVInt(local_68);
    break;
  case 0xf:
    slang::SVInt::SVInt<bool,void>(&local_78,l <= r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_78);
    slang::SVInt::~SVInt(&local_78);
    break;
  case 0x10:
    slang::SVInt::SVInt<bool,void>(&local_88,l < r);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_88);
    slang::SVInt::~SVInt(&local_88);
    break;
  case 0x13:
    local_231 = (bool)local_1d && (bool)local_1e;
    slang::SVInt::SVInt<bool,void>(&local_d8,local_231);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_d8);
    slang::SVInt::~SVInt(&local_d8);
    break;
  case 0x14:
    local_241 = (bool)local_1d || (bool)local_1e;
    slang::SVInt::SVInt<bool,void>(&local_e8,local_241);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_e8);
    slang::SVInt::~SVInt(&local_e8);
    break;
  case 0x15:
    local_251 = !(bool)local_1d || (bool)local_1e;
    slang::SVInt::SVInt<bool,void>(&local_f8,local_251);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_f8);
    slang::SVInt::~SVInt(&local_f8);
    break;
  case 0x16:
    if ((!(bool)local_1d) || (local_261 = false, (bool)local_1e)) {
      local_262 = !(bool)local_1e || (bool)local_1d;
      local_261 = local_262;
    }
    slang::SVInt::SVInt<bool,void>(&local_108,local_261);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_108);
    slang::SVInt::~SVInt(&local_108);
    break;
  case 0x1b:
    dVar1 = std::pow((double)(ulong)(uint)l,(double)(ulong)(uint)r);
    slang::shortreal_t::shortreal_t(&local_34,SUB84(dVar1,0));
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue evalFloatOp(BinaryOperator op, TFloat l, TFloat r) {
    bool bl = (bool)l;
    bool br = (bool)r;

    switch (op) {
        OP(Add, TRes(l + r));
        OP(Subtract, TRes(l - r));
        OP(Multiply, TRes(l * r));
        OP(Divide, TRes(l / r));
        OP(Power, TRes(std::pow(l, r)));
        OP(GreaterThanEqual, SVInt(l >= r));
        OP(GreaterThan, SVInt(l > r));
        OP(LessThanEqual, SVInt(l <= r));
        OP(LessThan, SVInt(l < r));
        OP(Equality, SVInt(l == r));
        OP(Inequality, SVInt(l != r));
        OP(CaseEquality, SVInt(l == r));
        OP(CaseInequality, SVInt(l != r));
        OP(LogicalAnd, SVInt(bl && br));
        OP(LogicalOr, SVInt(bl || br));
        OP(LogicalImplication, SVInt(!bl || br));
        OP(LogicalEquivalence, SVInt((!bl || br) && (!br || bl)));
        default:
            ASSUME_UNREACHABLE;
    }
}